

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImFontGlyphRangesBuilder::AddRanges(ImFontGlyphRangesBuilder *this,ImWchar *ranges)

{
  uint *puVar1;
  ushort uVar2;
  long lVar3;
  ImWchar c;
  ushort uVar4;
  
  while( true ) {
    uVar4 = *ranges;
    if (uVar4 == 0) break;
    uVar2 = ranges[1];
    lVar3 = *(long *)(this + 8);
    for (; uVar4 <= uVar2; uVar4 = uVar4 + 1) {
      puVar1 = (uint *)(lVar3 + (ulong)(uVar4 >> 5) * 4);
      *puVar1 = *puVar1 | 1 << ((byte)uVar4 & 0x1f);
    }
    ranges = ranges + 2;
  }
  return;
}

Assistant:

void ImFontGlyphRangesBuilder::AddRanges(const ImWchar* ranges)
{
    for (; ranges[0]; ranges += 2)
        for (ImWchar c = ranges[0]; c <= ranges[1]; c++)
            AddChar(c);
}